

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O0

void __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddDependency
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,ClusterIndex parent,
          ClusterIndex child)

{
  long lVar1;
  bool bVar2;
  reference pvVar3;
  Iterator *in_RDI;
  long in_FS_OFFSET;
  uint dec_of_chl;
  IntBitSet<unsigned_int> *__range2_1;
  IntBitSet<unsigned_int> *par_anc;
  uint anc_of_par;
  IntBitSet<unsigned_int> *__range2;
  IntBitSet<unsigned_int> *chl_des;
  IteratorEnd __end0_1;
  Iterator __begin0_1;
  IteratorEnd __end0;
  Iterator __begin0;
  IntBitSet<unsigned_int> *in_stack_ffffffffffffff88;
  Iterator *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                *)in_RDI,(size_type)in_stack_ffffffffffffff90);
  bVar2 = bitset_detail::IntBitSet<unsigned_int>::operator[]
                    ((IntBitSet<unsigned_int> *)in_stack_ffffffffffffff90,
                     (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  if (!bVar2) {
    pvVar3 = std::
             vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                           *)in_RDI,(size_type)in_stack_ffffffffffffff90);
    Ancestors((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)in_RDI,
              (ClusterIndex)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    bitset_detail::IntBitSet<unsigned_int>::begin
              ((IntBitSet<unsigned_int> *)in_stack_ffffffffffffff90);
    bitset_detail::IntBitSet<unsigned_int>::end(in_stack_ffffffffffffff88);
    while (bVar2 = bitset_detail::operator==(in_RDI,(IteratorEnd *)in_stack_ffffffffffffff90),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator*(in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff90 = (Iterator *)&pvVar3->descendants;
      std::
      vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    *)in_RDI,(size_type)&pvVar3->descendants);
      bitset_detail::IntBitSet<unsigned_int>::operator|=
                ((IntBitSet<unsigned_int> *)in_RDI,
                 (IntBitSet<unsigned_int> *)in_stack_ffffffffffffff90);
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator++(in_stack_ffffffffffffff90);
    }
    std::
    vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                  *)in_RDI,(size_type)in_stack_ffffffffffffff90);
    Descendants((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)in_RDI,
                (ClusterIndex)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    bitset_detail::IntBitSet<unsigned_int>::begin
              ((IntBitSet<unsigned_int> *)in_stack_ffffffffffffff90);
    bitset_detail::IntBitSet<unsigned_int>::end(in_stack_ffffffffffffff88);
    while (bVar2 = bitset_detail::operator==(in_RDI,(IteratorEnd *)in_stack_ffffffffffffff90),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator*(in_stack_ffffffffffffff90);
      std::
      vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ::operator[]((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    *)in_RDI,(size_type)in_stack_ffffffffffffff90);
      bitset_detail::IntBitSet<unsigned_int>::operator|=
                ((IntBitSet<unsigned_int> *)in_RDI,
                 (IntBitSet<unsigned_int> *)in_stack_ffffffffffffff90);
      bitset_detail::IntBitSet<unsigned_int>::Iterator::operator++(in_stack_ffffffffffffff90);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddDependency(ClusterIndex parent, ClusterIndex child) noexcept
    {
        // Bail out if dependency is already implied.
        if (entries[child].ancestors[parent]) return;
        // To each ancestor of the parent, add as descendants the descendants of the child.
        const auto& chl_des = entries[child].descendants;
        for (auto anc_of_par : Ancestors(parent)) {
            entries[anc_of_par].descendants |= chl_des;
        }
        // To each descendant of the child, add as ancestors the ancestors of the parent.
        const auto& par_anc = entries[parent].ancestors;
        for (auto dec_of_chl : Descendants(child)) {
            entries[dec_of_chl].ancestors |= par_anc;
        }
    }